

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O3

void __thiscall CVmObjTable::gc_trace_stack(CVmObjTable *this)

{
  vm_obj_id_t id;
  vm_val_t *pvVar1;
  long lVar2;
  long lVar3;
  
  if ((long)sp_ - (long)G_interpreter_X.super_CVmStack.arr_ != 0) {
    lVar3 = (long)sp_ - (long)G_interpreter_X.super_CVmStack.arr_ >> 4;
    lVar3 = lVar3 + (ulong)(lVar3 == 0);
    lVar2 = -8;
    pvVar1 = sp_;
    do {
      if ((*(int *)((long)pvVar1 + lVar2 + -8) == 5) &&
         (id = *(vm_obj_id_t *)((long)&pvVar1->typ + lVar2), id != 0)) {
        add_to_gc_queue(this,id,2);
        pvVar1 = sp_;
      }
      lVar2 = lVar2 + -0x10;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  return;
}

Assistant:

void count_free()
    {
        ++cur_freed;
        ++tot_freed;
    }